

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O2

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,true,false>
          (hugeint_t min_value,hugeint_t max_value)

{
  hugeint_t b;
  hugeint_t a;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint64_t in_stack_ffffffffffffffa8;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t in_stack_ffffffffffffffc0;
  hugeint_t min_value_local;
  
  min_value_local.upper = min_value.upper;
  min_value_local.lower = min_value.lower;
  uVar4 = 0;
  uVar5 = 0x8000000000000000;
  bVar1 = hugeint_t::operator==(&min_value_local,(hugeint_t *)&stack0xffffffffffffffb0);
  bVar3 = 0x80;
  if (!bVar1) {
    hugeint_t::operator-(&min_value_local);
    a.upper = in_stack_ffffffffffffffc0;
    a.lower = uVar5;
    b.upper = uVar4;
    b.lower = in_stack_ffffffffffffffa8;
    MaxValue<duckdb::hugeint_t>(a,b);
    hugeint_t::hugeint_t((hugeint_t *)&stack0xffffffffffffffc0,0);
    bVar1 = hugeint_t::operator==
                      ((hugeint_t *)&stack0xffffffffffffffb0,(hugeint_t *)&stack0xffffffffffffffc0);
    bVar3 = 0;
    if (!bVar1) {
      bVar2 = 1;
      while( true ) {
        bVar1 = hugeint_t::operator_cast_to_bool((hugeint_t *)&stack0xffffffffffffffb0);
        if (!bVar1) break;
        bVar2 = bVar2 + 1;
        hugeint_t::hugeint_t((hugeint_t *)&stack0xffffffffffffffc0,1);
        hugeint_t::operator>>=
                  ((hugeint_t *)&stack0xffffffffffffffb0,(hugeint_t *)&stack0xffffffffffffffc0);
      }
      bVar3 = 0x80;
      if (bVar2 < 0x71) {
        bVar3 = bVar2;
      }
    }
  }
  return bVar3;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}